

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O2

void __thiscall Bitmap_Operation::BitmapInfoHeader::BitmapInfoHeader(BitmapInfoHeader *this)

{
  (this->super_BitmapDibHeader)._vptr_BitmapDibHeader = (_func_int **)&PTR__BitmapDibHeader_0011fbf8
  ;
  this->biSize = 0x28;
  this->biWidth = 0;
  this->biHeight = 0;
  this->biPlanes = 1;
  this->biBitCount = 8;
  this->biClrUsed = 0;
  this->biClrImportant = 0;
  this->biCompress = 0;
  this->biSizeImage = 0;
  this->biXPelsPerMeter = 0;
  this->biYPelsPerMeter = 0;
  this->overallSize = 0x28;
  return;
}

Assistant:

BitmapInfoHeader()
            : biSize         ( 40 ) // the size of this structure
            , biWidth        ( 0 )  // width of image
            , biHeight       ( 0 )  // height of image
            , biPlanes       ( 1 )  // number of colour planes (always 1)
            , biBitCount     ( 8 )  // bits per pixel
            , biCompress     ( 0 )  // compression type
            , biSizeImage    ( 0 )  // image data size in bytes
            , biXPelsPerMeter( 0 )  // pixels per meter in X direction
            , biYPelsPerMeter( 0 )  // pixels per meter in Y direction
            , biClrUsed      ( 0 )  // Number of colours used
            , biClrImportant ( 0 )  // important colours
            , overallSize    ( 40 ) // real size of this structure for bitmap format
        { }